

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::RegexpMatchesFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  FunctionNullHandling in_stack_fffffffffffffb88;
  bind_lambda_function_t in_stack_fffffffffffffb90;
  scalar_function_t local_468;
  scalar_function_t local_448;
  LogicalType local_428;
  vector<duckdb::LogicalType,_true> local_410;
  LogicalType local_3f8;
  vector<duckdb::LogicalType,_true> local_3e0;
  LogicalType local_3c8 [4];
  LogicalType local_368;
  string local_350;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"regexp_matches","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  LogicalType::LogicalType(local_3c8,VARCHAR);
  LogicalType::LogicalType(local_3c8 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_3c8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3e0,__l,
             (allocator_type *)&stack0xfffffffffffffb97);
  LogicalType::LogicalType(&local_3f8,BOOLEAN);
  local_448.super__Function_base._M_functor._8_8_ = 0;
  local_448.super__Function_base._M_functor._M_unused._M_object =
       RegexpMatchesFunction<duckdb::RegexPartialMatch>;
  local_448._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_448.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_368,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  varargs._0_8_ = &local_368;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_208,&local_3e0,&local_3f8,&local_448,RegexpMatchesBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,RegexInitLocalState,
             varargs,CONSISTENT,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_368);
  if (local_448.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_448.super__Function_base._M_manager)
              ((_Any_data *)&local_448,(_Any_data *)&local_448,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3e0);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3c8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_3c8,VARCHAR);
  LogicalType::LogicalType(local_3c8 + 1,VARCHAR);
  LogicalType::LogicalType(local_3c8 + 2,VARCHAR);
  __l_00._M_len = 3;
  __l_00._M_array = local_3c8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_410,__l_00,
             (allocator_type *)&stack0xfffffffffffffb97);
  LogicalType::LogicalType(&local_428,BOOLEAN);
  local_468.super__Function_base._M_functor._8_8_ = 0;
  local_468.super__Function_base._M_functor._M_unused._M_object =
       RegexpMatchesFunction<duckdb::RegexPartialMatch>;
  local_468._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_468.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_3c8 + 3,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  varargs_00._0_8_ = local_3c8 + 3;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&local_330,&local_410,&local_428,&local_468,RegexpMatchesBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,RegexInitLocalState,
             varargs_00,CONSISTENT,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02433f30;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(local_3c8 + 3);
  if (local_468.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_468.super__Function_base._M_manager)
              ((_Any_data *)&local_468,(_Any_data *)&local_468,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_428);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_410);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3c8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet RegexpMatchesFun::GetFunctions() {
	ScalarFunctionSet regexp_partial_match("regexp_matches");
	regexp_partial_match.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN, RegexpMatchesFunction<RegexPartialMatch>,
	    RegexpMatchesBind, nullptr, nullptr, RegexInitLocalState, LogicalType::INVALID, FunctionStability::CONSISTENT,
	    FunctionNullHandling::SPECIAL_HANDLING));
	regexp_partial_match.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN,
	    RegexpMatchesFunction<RegexPartialMatch>, RegexpMatchesBind, nullptr, nullptr, RegexInitLocalState,
	    LogicalType::INVALID, FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	for (auto &func : regexp_partial_match.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return (regexp_partial_match);
}